

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

LogicalExpr __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
::ReadLogicalExpr(NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                  *this,int opcode)

{
  Kind kind;
  Kind KVar1;
  char *pcVar2;
  NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *pNVar3;
  BasicProblem<mp::BasicProblemParams<int>_> *pBVar4;
  int iVar5;
  NumericExpr NVar6;
  CountExpr CVar7;
  ExprBase EVar8;
  ExprBase EVar9;
  LogicalExpr LVar10;
  LogicalExpr LVar11;
  LogicalExpr LVar12;
  Impl *pIVar13;
  BinaryReader<mp::internal::IdentityConverter> *pBVar14;
  long lVar15;
  BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)66,_(mp::expr::Kind)67>_>
  BVar16;
  BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>_>
  BVar17;
  Impl *local_58;
  undefined8 uStack_50;
  ArgList local_40;
  
  kind = OpCodeInfo::INFO[opcode].kind;
  KVar1 = OpCodeInfo::INFO[opcode].first_kind;
  if ((int)KVar1 < 0x3b) {
    if (KVar1 == NOT) {
      pNVar3 = this->handler_;
      LVar12 = ReadLogicalExpr(this);
      pBVar4 = pNVar3->builder_;
      local_58 = (Impl *)0x0;
      std::
      vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
      ::emplace_back<mp::internal::ExprBase::Impl_const*>
                ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
                  *)&(pBVar4->super_ExprFactory).exprs_,&local_58);
      pIVar13 = (Impl *)operator_new__(0x80);
      pIVar13->kind_ = NOT;
      (pBVar4->super_ExprFactory).exprs_.
      super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
      ._M_impl.super__Vector_impl_data._M_finish[-1] = pIVar13;
      *(ExprBase *)&pIVar13[2].kind_ = LVar12.super_ExprBase.impl_;
      return (LogicalExpr)pIVar13;
    }
    if (KVar1 == FIRST_BINARY_LOGICAL) {
      EVar8.impl_ = (Impl *)ReadLogicalExpr(this);
      EVar9.impl_ = (Impl *)ReadLogicalExpr(this);
LAB_0015b742:
      pBVar4 = this->handler_->builder_;
      local_58 = (Impl *)0x0;
      std::
      vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
      ::emplace_back<mp::internal::ExprBase::Impl_const*>
                ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
                  *)&(pBVar4->super_ExprFactory).exprs_,&local_58);
      pIVar13 = (Impl *)operator_new__(0xc0);
      pIVar13->kind_ = kind;
      (pBVar4->super_ExprFactory).exprs_.
      super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
      ._M_impl.super__Vector_impl_data._M_finish[-1] = pIVar13;
      *(Impl **)(pIVar13 + 2) = EVar8.impl_;
      *(Impl **)(pIVar13 + 4) = EVar9.impl_;
      return (LogicalExpr)pIVar13;
    }
    if (KVar1 == FIRST_RELATIONAL) {
      pBVar14 = this->reader_;
      pcVar2 = (pBVar14->super_BinaryReaderBase).super_ReaderBase.ptr_;
      (pBVar14->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar2;
      (pBVar14->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar2 + 1;
      EVar8.impl_ = (Impl *)ReadNumericExpr(this,*pcVar2,false);
      pBVar14 = this->reader_;
      pcVar2 = (pBVar14->super_BinaryReaderBase).super_ReaderBase.ptr_;
      (pBVar14->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar2;
      (pBVar14->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar2 + 1;
      EVar9.impl_ = (Impl *)ReadNumericExpr(this,*pcVar2,false);
      goto LAB_0015b742;
    }
switchD_0015b49d_caseD_3c:
    local_58 = (Impl *)0x0;
    uStack_50 = 0;
    local_40.types_ = 0;
    local_40.field_1.values_ = (Value *)&local_58;
    BinaryReaderBase::ReportError
              (&this->reader_->super_BinaryReaderBase,(CStringRef)0x1752e9,&local_40);
    EVar8.impl_ = (Impl *)0x0;
  }
  else {
    switch(KVar1) {
    case ATLEAST:
      pBVar14 = this->reader_;
      pcVar2 = (pBVar14->super_BinaryReaderBase).super_ReaderBase.ptr_;
      (pBVar14->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar2;
      (pBVar14->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar2 + 1;
      NVar6 = ReadNumericExpr(this,*pcVar2,false);
      pBVar14 = this->reader_;
      pcVar2 = (pBVar14->super_BinaryReaderBase).super_ReaderBase.ptr_;
      (pBVar14->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar2;
      (pBVar14->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar2 + 1;
      if (*pcVar2 == 'o') {
        iVar5 = ReadOpCode(this);
        if (OpCodeInfo::INFO[iVar5].kind != COUNT) {
          pBVar14 = this->reader_;
          goto LAB_0015b4ea;
        }
      }
      else {
LAB_0015b4ea:
        local_58 = (Impl *)0x0;
        uStack_50 = 0;
        local_40.types_ = 0;
        local_40.field_1.values_ = (Value *)&local_58;
        BinaryReaderBase::ReportError
                  (&pBVar14->super_BinaryReaderBase,(CStringRef)0x1752cf,&local_40);
      }
      pNVar3 = this->handler_;
      CVar7 = ReadCountExpr(this);
      pBVar4 = pNVar3->builder_;
      local_58 = (Impl *)0x0;
      std::
      vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
      ::emplace_back<mp::internal::ExprBase::Impl_const*>
                ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
                  *)&(pBVar4->super_ExprFactory).exprs_,&local_58);
      EVar8.impl_ = (Impl *)operator_new__(0xc0);
      (EVar8.impl_)->kind_ = kind;
      (pBVar4->super_ExprFactory).exprs_.
      super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
      ._M_impl.super__Vector_impl_data._M_finish[-1] = EVar8.impl_;
      *(ExprBase *)&EVar8.impl_[2].kind_ = NVar6.super_ExprBase.impl_;
      *(BasicExpr<(mp::expr::Kind)47,_(mp::expr::Kind)47> *)&EVar8.impl_[4].kind_ =
           CVar7.super_BasicExpr<(mp::expr::Kind)47,_(mp::expr::Kind)47>.super_ExprBase.impl_;
      break;
    default:
      goto switchD_0015b49d_caseD_3c;
    case IMPLICATION:
      LVar12 = ReadLogicalExpr(this);
      LVar10 = ReadLogicalExpr(this);
      LVar11 = ReadLogicalExpr(this);
      pBVar4 = this->handler_->builder_;
      local_58 = (Impl *)0x0;
      std::
      vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
      ::emplace_back<mp::internal::ExprBase::Impl_const*>
                ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
                  *)&(pBVar4->super_ExprFactory).exprs_,&local_58);
      EVar8.impl_ = (Impl *)operator_new__(0x100);
      (EVar8.impl_)->kind_ = IMPLICATION;
      (pBVar4->super_ExprFactory).exprs_.
      super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
      ._M_impl.super__Vector_impl_data._M_finish[-1] = EVar8.impl_;
      *(ExprBase *)&EVar8.impl_[2].kind_ = LVar12.super_ExprBase.impl_;
      *(ExprBase *)&EVar8.impl_[4].kind_ = LVar10.super_ExprBase.impl_;
      *(ExprBase *)&EVar8.impl_[6].kind_ = LVar11.super_ExprBase.impl_;
      break;
    case EXISTS:
      iVar5 = ReadNumArgs(this,3);
      BVar16 = BasicExprFactory<std::allocator<char>>::
               BeginIterated<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)66,(mp::expr::Kind)67>>
                         ((BasicExprFactory<std::allocator<char>> *)this->handler_->builder_,kind,
                          iVar5);
      EVar8.impl_ = &(BVar16.impl_)->super_Impl;
      if (0 < iVar5) {
        lVar15 = 0;
        do {
          EVar9.impl_ = (Impl *)ReadLogicalExpr(this);
          ((Impl *)EVar8.impl_)->args[BVar16.arg_index_ + lVar15] = EVar9.impl_;
          lVar15 = lVar15 + 1;
        } while (iVar5 != (int)lVar15);
      }
      break;
    case ALLDIFF:
      iVar5 = ReadNumArgs(this,1);
      BVar17 = BasicExprFactory<std::allocator<char>>::
               BeginIterated<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)68,(mp::expr::Kind)69>>
                         ((BasicExprFactory<std::allocator<char>> *)this->handler_->builder_,kind,
                          iVar5);
      EVar8.impl_ = &(BVar17.impl_)->super_Impl;
      if (0 < iVar5) {
        lVar15 = 0;
        do {
          pBVar14 = this->reader_;
          pcVar2 = (pBVar14->super_BinaryReaderBase).super_ReaderBase.ptr_;
          (pBVar14->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar2;
          (pBVar14->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar2 + 1;
          EVar9.impl_ = (Impl *)ReadNumericExpr(this,*pcVar2,false);
          ((Impl *)EVar8.impl_)->args[BVar17.arg_index_ + lVar15] = EVar9.impl_;
          lVar15 = lVar15 + 1;
        } while (iVar5 != (int)lVar15);
      }
    }
  }
  return (LogicalExpr)(ExprBase)EVar8.impl_;
}

Assistant:

typename Handler::LogicalExpr
    NLReader<Reader, Handler>::ReadLogicalExpr(int opcode) {
  const internal::OpCodeInfo &info = internal::GetOpCodeInfo(opcode);
  expr::Kind kind = info.kind;
  switch (info.first_kind) {
  case expr::NOT:
    return handler_.OnNot(ReadLogicalExpr());
  case expr::FIRST_BINARY_LOGICAL: {
    BinaryArgReader<LogicalExprReader> args(*this);
    return handler_.OnBinaryLogical(kind, args.lhs, args.rhs);
  }
  case expr::FIRST_RELATIONAL: {
    BinaryArgReader<> args(*this);
    return handler_.OnRelational(kind, args.lhs, args.rhs);
  }
  case expr::FIRST_LOGICAL_COUNT: {
    NumericExpr lhs = ReadNumericExpr();
    char c = reader_.ReadChar();
    if (c != 'o' || internal::GetOpCodeInfo(ReadOpCode()).kind != expr::COUNT)
      reader_.ReportError("expected count expression");
    return handler_.OnLogicalCount(kind, lhs, ReadCountExpr());
  }
  case expr::IMPLICATION: {
    // Read an implication (=>).
    LogicalExpr condition = ReadLogicalExpr();
    LogicalExpr then_expr = ReadLogicalExpr();
    LogicalExpr else_expr = ReadLogicalExpr();
    return handler_.OnImplication(condition, then_expr, else_expr);
  }
  case expr::FIRST_ITERATED_LOGICAL: {
    // Read an iterated logical expression (exists or forall).
    int num_args = ReadNumArgs();
    typename Handler::LogicalArgHandler args =
        handler_.BeginIteratedLogical(kind, num_args);
    ReadArgs<LogicalExprReader>(num_args, args);
    return handler_.EndIteratedLogical(args);
  }
  case expr::FIRST_PAIRWISE: {
    // Read a pairwise expression (alldiff or !alldiff).
    int num_args = ReadNumArgs(1);
    typename Handler::PairwiseArgHandler args =
        handler_.BeginPairwise(kind, num_args);
    ReadArgs<NumericExprReader>(num_args, args);
    return handler_.EndPairwise(args);
  }
  default:
    reader_.ReportError("expected logical expression opcode");
  }
  return LogicalExpr();
}